

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDV.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::HDV::get_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,HDV *this,
          size_t address)

{
  long source_address;
  size_t in_RCX;
  pointer *ppuVar1;
  long offset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  FILE *local_48;
  
  source_address = address - 0x40;
  offset = -1;
  if (0x3f < (long)address) {
    in_RCX = this->image_size_ - 0x200;
    if (source_address * 0x200 <= (long)in_RCX) {
      offset = this->file_start_ + source_address * 0x200;
    }
  }
  if ((long)address < 0x40) {
    ppuVar1 = &local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider>::
    convert_source_block(__return_storage_ptr__,&this->mapper_,source_address,&local_68);
    local_48 = (FILE *)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    ppuVar1 = (pointer *)&stack0xffffffffffffffc8;
    FileHolder::seek(&this->file_,offset,0);
    FileHolder::read((FileHolder *)&stack0xffffffffffffffb8,(int)&this->file_,(void *)0x200,in_RCX);
    Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::AppleII::VolumeProvider>::
    convert_source_block
              (__return_storage_ptr__,&this->mapper_,source_address,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffb8);
  }
  if (local_48 != (FILE *)0x0) {
    operator_delete(local_48,(long)*ppuVar1 - (long)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> HDV::get_block(size_t address) {
	const auto source_address = mapper_.to_source_address(address);
	const auto file_offset = offset_for_block(source_address);

	if(source_address >= 0) {
		file_.seek(file_offset, SEEK_SET);
		return mapper_.convert_source_block(source_address, file_.read(get_block_size()));
	} else {
		return mapper_.convert_source_block(source_address);
	}
}